

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O0

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *uri,size_t len)

{
  Ch *pCVar1;
  SizeType SVar2;
  ulong local_38;
  size_t pos2;
  size_t pos1;
  size_t start;
  size_t len_local;
  Ch *uri_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  pos1 = 0;
  pos2 = 0;
  local_38 = 0;
  Allocate(this,len);
  if (len != 0) {
    for (; (pos2 < len && (uri[pos2] != ':')); pos2 = pos2 + 1) {
    }
    if (pos2 != len) {
      for (; (((local_38 < len && (uri[local_38] != '/')) && (uri[local_38] != '?')) &&
             (uri[local_38] != '#')); local_38 = local_38 + 1) {
      }
      if (pos2 < local_38) {
        pos1 = pos2 + 1;
        memcpy(this->scheme_,uri,pos1);
        this->scheme_[pos1] = '\0';
      }
    }
  }
  pCVar1 = this->scheme_;
  SVar2 = GetSchemeStringLength(this);
  this->auth_ = pCVar1 + SVar2;
  this->auth_ = this->auth_ + 1;
  *this->auth_ = '\0';
  if (((pos1 < len - 1) && (uri[pos1] == '/')) && (uri[pos1 + 1] == '/')) {
    for (local_38 = pos1 + 2;
        ((local_38 < len && (uri[local_38] != '/')) &&
        ((uri[local_38] != '?' && (uri[local_38] != '#')))); local_38 = local_38 + 1) {
    }
    memcpy(this->auth_,uri + pos1,local_38 - pos1);
    this->auth_[local_38 - pos1] = '\0';
    pos1 = local_38;
  }
  pCVar1 = this->auth_;
  SVar2 = GetAuthStringLength(this);
  this->path_ = pCVar1 + SVar2;
  this->path_ = this->path_ + 1;
  *this->path_ = '\0';
  if (pos1 < len) {
    for (local_38 = pos1; ((local_38 < len && (uri[local_38] != '?')) && (uri[local_38] != '#'));
        local_38 = local_38 + 1) {
    }
    if (pos1 != local_38) {
      memcpy(this->path_,uri + pos1,local_38 - pos1);
      this->path_[local_38 - pos1] = '\0';
      if (*this->path_ == '/') {
        RemoveDotSegments(this);
      }
      pos1 = local_38;
    }
  }
  pCVar1 = this->path_;
  SVar2 = GetPathStringLength(this);
  this->query_ = pCVar1 + SVar2;
  this->query_ = this->query_ + 1;
  *this->query_ = '\0';
  if ((pos1 < len) && (local_38 = pos1, uri[pos1] == '?')) {
    do {
      local_38 = local_38 + 1;
      if (len <= local_38) break;
    } while (uri[local_38] != '#');
    if (pos1 != local_38) {
      memcpy(this->query_,uri + pos1,local_38 - pos1);
      this->query_[local_38 - pos1] = '\0';
      pos1 = local_38;
    }
  }
  pCVar1 = this->query_;
  SVar2 = GetQueryStringLength(this);
  this->frag_ = pCVar1 + SVar2;
  this->frag_ = this->frag_ + 1;
  *this->frag_ = '\0';
  if ((pos1 < len) && (uri[pos1] == '#')) {
    memcpy(this->frag_,uri + pos1,len - pos1);
    this->frag_[len - pos1] = '\0';
  }
  pCVar1 = this->frag_;
  SVar2 = GetFragStringLength(this);
  this->base_ = pCVar1 + (ulong)SVar2 + 1;
  SetBase(this);
  pCVar1 = this->base_;
  SVar2 = GetBaseStringLength(this);
  this->uri_ = pCVar1 + (ulong)SVar2 + 1;
  SetUri(this);
  return;
}

Assistant:

void Parse(const Ch* uri, std::size_t len) {
        std::size_t start = 0, pos1 = 0, pos2 = 0;
        Allocate(len);

        // Look for scheme ([^:/?#]+):)?
        if (start < len) {
            while (pos1 < len) {
                if (uri[pos1] == ':') break;
                pos1++;
            }
            if (pos1 != len) {
                while (pos2 < len) {
                    if (uri[pos2] == '/') break;
                    if (uri[pos2] == '?') break;
                    if (uri[pos2] == '#') break;
                    pos2++;
                }
                if (pos1 < pos2) {
                    pos1++;
                    std::memcpy(scheme_, &uri[start], pos1 * sizeof(Ch));
                    scheme_[pos1] = '\0';
                    start = pos1;
                }
            }
        }
        // Look for auth (//([^/?#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        auth_ = scheme_ + GetSchemeStringLength();
        auth_++;
        *auth_ = '\0';
        if (start < len - 1 && uri[start] == '/' && uri[start + 1] == '/') {
            pos2 = start + 2;
            while (pos2 < len) {
                if (uri[pos2] == '/') break;
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            std::memcpy(auth_, &uri[start], (pos2 - start) * sizeof(Ch));
            auth_[pos2 - start] = '\0';
            start = pos2;
        }
        // Look for path ([^?#]*)
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        path_ = auth_ + GetAuthStringLength();
        path_++;
        *path_ = '\0';
        if (start < len) {
            pos2 = start;
            while (pos2 < len) {
                if (uri[pos2] == '?') break;
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(path_, &uri[start], (pos2 - start) * sizeof(Ch));
                path_[pos2 - start] = '\0';
                if (path_[0] == '/')
                    RemoveDotSegments();   // absolute path - normalize
                start = pos2;
            }
        }
        // Look for query (\?([^#]*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        query_ = path_ + GetPathStringLength();
        query_++;
        *query_ = '\0';
        if (start < len && uri[start] == '?') {
            pos2 = start + 1;
            while (pos2 < len) {
                if (uri[pos2] == '#') break;
                pos2++;
            }
            if (start != pos2) {
                std::memcpy(query_, &uri[start], (pos2 - start) * sizeof(Ch));
                query_[pos2 - start] = '\0';
                start = pos2;
            }
        }
        // Look for fragment (#(.*))?
        // Note need to set, increment, assign in 3 stages to avoid compiler warning bug.
        frag_ = query_ + GetQueryStringLength();
        frag_++;
        *frag_ = '\0';
        if (start < len && uri[start] == '#') {
            std::memcpy(frag_, &uri[start], (len - start) * sizeof(Ch));
            frag_[len - start] = '\0';
        }

        // Re-constitute base_ and uri_
        base_ = frag_ + GetFragStringLength() + 1;
        SetBase();
        uri_ = base_ + GetBaseStringLength() + 1;
        SetUri();
    }